

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O0

string * __thiscall
absl::lts_20240722::str_format_internal::FlagsToString_abi_cxx11_
          (string *__return_storage_ptr__,str_format_internal *this,Flags v)

{
  Flags haystack;
  Flags v_local;
  string *s;
  
  haystack = (Flags)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  FlagsContains(haystack,kLeft);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  FlagsContains(haystack,kShowPos);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  FlagsContains(haystack,kSignCol);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  FlagsContains(haystack,kAlt);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  FlagsContains(haystack,kZero);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string FlagsToString(Flags v) {
  std::string s;
  s.append(FlagsContains(v, Flags::kLeft) ? "-" : "");
  s.append(FlagsContains(v, Flags::kShowPos) ? "+" : "");
  s.append(FlagsContains(v, Flags::kSignCol) ? " " : "");
  s.append(FlagsContains(v, Flags::kAlt) ? "#" : "");
  s.append(FlagsContains(v, Flags::kZero) ? "0" : "");
  return s;
}